

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::char_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
           *this,align_spec *spec,char_writer *f)

{
  type pwVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  char_type fill;
  
  uVar3 = (ulong)spec->width_;
  if (uVar3 < 2) {
    pwVar2 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,1);
LAB_0012f37a:
    *pwVar2 = f->value;
  }
  else {
    pwVar1 = internal::reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,
                        uVar3);
    uVar3 = uVar3 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      pwVar1 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1,uVar3 >> 1,&fill);
      *pwVar1 = f->value;
      uVar3 = uVar3 - (uVar3 >> 1);
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pwVar2 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1,uVar3,&fill);
        goto LAB_0012f37a;
      }
      *pwVar1 = f->value;
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1 + 1,uVar3,&fill);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }